

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  pointer pBVar5;
  uint *puVar6;
  int *arg;
  const_iterator __end5;
  const_iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  Instance instance;
  int num_threads;
  const_iterator __end4;
  const_iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> *thread_counts;
  vector<int,_std::allocator<int>_> *args;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3;
  BenchmarkImp *family;
  unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
  *bench_family;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
  *__range2;
  MutexLock l;
  vector<int,_std::allocator<int>_> one_thread;
  Regex re;
  string error_msg;
  Mutex *in_stack_fffffffffffffd78;
  undefined5 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd85;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  value_type *__x;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  BenchmarkImp *in_stack_fffffffffffffd98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  Regex *in_stack_fffffffffffffdc0;
  string local_228 [32];
  string local_208 [32];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe20;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  Mutex *local_1b0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  vector<int,_std::allocator<int>_> *local_118;
  vector<int,_std::allocator<int>_> *local_110;
  Mutex *local_108;
  vector<int,_std::allocator<int>_> *local_100;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  BenchmarkImp *local_d0;
  reference local_c8;
  unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
  *local_c0;
  __normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
  local_b8 [2];
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  vector<int,_std::allocator<int>_> local_90;
  undefined4 local_78;
  string local_40 [63];
  byte local_1;
  
  std::__cxx11::string::string(local_40);
  Regex::Regex((Regex *)0x164c66);
  bVar2 = Regex::Init(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0)
  ;
  if (bVar2) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x164d3b);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT15(in_stack_fffffffffffffd85,in_stack_fffffffffffffd80))),
               (value_type *)in_stack_fffffffffffffd78);
    MutexLock::MutexLock
              ((MutexLock *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT15(in_stack_fffffffffffffd85,in_stack_fffffffffffffd80))),
               in_stack_fffffffffffffd78);
    local_b8[0]._M_current =
         (unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
          *)std::
            vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
            ::begin((vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                     *)in_stack_fffffffffffffd78);
    local_c0 = (unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                *)std::
                  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                  ::end((vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                         *)in_stack_fffffffffffffd78);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT15(in_stack_fffffffffffffd85,
                                                            in_stack_fffffffffffffd80))),
                              (__normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
                               *)in_stack_fffffffffffffd78), bVar2) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
                 ::operator*(local_b8);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                          *)0x164de9);
      if (bVar2) {
        pBVar5 = std::
                 unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ::operator->((unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                               *)0x164e18);
        local_d0 = pBVar5->imp_;
        iVar3 = BenchmarkImp::ArgsCnt
                          ((BenchmarkImp *)
                           CONCAT17(in_stack_fffffffffffffd87,
                                    CONCAT16(in_stack_fffffffffffffd86,
                                             CONCAT15(in_stack_fffffffffffffd85,
                                                      in_stack_fffffffffffffd80))));
        if (iVar3 == -1) {
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          in_stack_fffffffffffffda0 = &local_e8;
          in_stack_fffffffffffffd98 = local_d0;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x164e7a);
          BenchmarkImp::Args((BenchmarkImp *)
                             CONCAT17(in_stack_fffffffffffffd87,
                                      CONCAT16(in_stack_fffffffffffffd86,
                                               CONCAT15(in_stack_fffffffffffffd85,
                                                        in_stack_fffffffffffffd80))),
                             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd90);
        }
        local_f0 = &local_d0->args_;
        local_f8._M_current =
             (vector<int,_std::allocator<int>_> *)
             std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)in_stack_fffffffffffffd78);
        local_100 = (vector<int,_std::allocator<int>_> *)
                    std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)in_stack_fffffffffffffd78);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd87,
                                              CONCAT16(in_stack_fffffffffffffd86,
                                                       CONCAT15(in_stack_fffffffffffffd85,
                                                                in_stack_fffffffffffffd80))),
                                  (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)in_stack_fffffffffffffd78), bVar2) {
          local_108 = (Mutex *)__gnu_cxx::
                               __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                               ::operator*(&local_f8);
          bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffd90);
          if (bVar2) {
            in_stack_fffffffffffffd90 = &local_90;
          }
          else {
            in_stack_fffffffffffffd90 = &local_d0->thread_counts_;
          }
          local_118 = in_stack_fffffffffffffd90;
          local_110 = in_stack_fffffffffffffd90;
          local_120._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
          std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffd87,
                                                CONCAT16(in_stack_fffffffffffffd86,
                                                         CONCAT15(in_stack_fffffffffffffd85,
                                                                  in_stack_fffffffffffffd80))),
                                    (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffd78), bVar2) {
            puVar6 = (uint *)__gnu_cxx::
                             __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ::operator*(&local_120);
            uVar1 = *puVar6;
            __x = (value_type *)&stack0xfffffffffffffe58;
            Benchmark::Instance::Instance
                      ((Instance *)
                       CONCAT17(in_stack_fffffffffffffd87,
                                CONCAT16(in_stack_fffffffffffffd86,
                                         CONCAT15(in_stack_fffffffffffffd85,
                                                  in_stack_fffffffffffffd80))));
            std::__cxx11::string::operator=((string *)__x,(string *)local_d0);
            std::
            unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
            ::get((unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                   *)CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,
                                       CONCAT15(in_stack_fffffffffffffd85,in_stack_fffffffffffffd80)
                                      )));
            std::vector<int,_std::allocator<int>_>::operator=
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffd90);
            local_1b0 = local_108;
            local_1b8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)CONCAT17(in_stack_fffffffffffffd87,
                                                  CONCAT16(in_stack_fffffffffffffd86,
                                                           CONCAT15(in_stack_fffffffffffffd85,
                                                                    in_stack_fffffffffffffd80))),
                                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffd78), bVar2) {
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_1b8);
              AppendHumanReadable(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_1b8);
            }
            in_stack_fffffffffffffd87 =
                 anon_unknown_1::IsZero
                           ((double)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT15(in_stack_fffffffffffffd85,
                                                               in_stack_fffffffffffffd80))));
            if (!(bool)in_stack_fffffffffffffd87) {
              StringPrintF_abi_cxx11_
                        (SUB84(local_d0->min_time_,0),&stack0xfffffffffffffe18,"/min_time:%0.3f");
              std::__cxx11::string::operator+=
                        ((string *)&stack0xfffffffffffffe58,(string *)&stack0xfffffffffffffe18);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
            }
            if (local_d0->repetitions_ != 0) {
              StringPrintF_abi_cxx11_
                        ((char *)local_208,"/repeats:%d",(ulong)(uint)local_d0->repetitions_);
              std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffe58,local_208);
              std::__cxx11::string::~string(local_208);
            }
            if ((local_d0->use_manual_time_ & 1U) == 0) {
              if ((local_d0->use_real_time_ & 1U) != 0) {
                std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffe58,"/real_time");
              }
            }
            else {
              std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffe58,"/manual_time");
            }
            bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffd90);
            if (!bVar2) {
              StringPrintF_abi_cxx11_((char *)local_228,"/threads:%d",(ulong)uVar1);
              std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffe58,local_228);
              std::__cxx11::string::~string(local_228);
            }
            in_stack_fffffffffffffd86 =
                 Regex::Match((Regex *)__x,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffd87,
                                       CONCAT16(in_stack_fffffffffffffd86,
                                                CONCAT15(in_stack_fffffffffffffd85,
                                                         in_stack_fffffffffffffd80))));
            if ((bool)in_stack_fffffffffffffd86) {
              in_stack_fffffffffffffd78 = local_108;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd87,
                                 CONCAT16(in_stack_fffffffffffffd86,
                                          CONCAT15(in_stack_fffffffffffffd85,
                                                   in_stack_fffffffffffffd80))));
              in_stack_fffffffffffffd85 =
                   std::operator==(in_stack_fffffffffffffda0,
                                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd98);
              std::
              vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ::push_back((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                           *)in_stack_fffffffffffffd90,__x);
            }
            Benchmark::Instance::~Instance
                      ((Instance *)
                       CONCAT17(in_stack_fffffffffffffd87,
                                CONCAT16(in_stack_fffffffffffffd86,
                                         CONCAT15(in_stack_fffffffffffffd85,
                                                  in_stack_fffffffffffffd80))));
            __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator++(&local_120);
          }
          __gnu_cxx::
          __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          ::operator++(&local_f8);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
      ::operator++(local_b8);
    }
    local_1 = 1;
    local_78 = 1;
    MutexLock::~MutexLock((MutexLock *)0x165493);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd90);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Could not compile benchmark re: ");
    poVar4 = std::operator<<(poVar4,local_40);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_78 = 1;
  }
  Regex::~Regex((Regex *)0x1654cb);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->ArgsCnt() == -1) {
      family->Args({});
    }

    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.report_mode = family->report_mode_;
        instance.arg = args;
        instance.time_unit = family->time_unit_;
        instance.range_multiplier = family->range_multiplier_;
        instance.min_time = family->min_time_;
        instance.repetitions = family->repetitions_;
        instance.use_real_time = family->use_real_time_;
        instance.use_manual_time = family->use_manual_time_;
        instance.complexity = family->complexity_;
        instance.complexity_lambda = family->complexity_lambda_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        for (auto const& arg : args) {
          AppendHumanReadable(arg, &instance.name);
        }

        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->repetitions_ != 0) {
          instance.name +=  StringPrintF("/repeats:%d",  family->repetitions_);
        }
        if (family->use_manual_time_) {
          instance.name +=  "/manual_time";
        } else if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          instance.last_benchmark_instance = (args == family->args_.back());
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}